

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.cpp
# Opt level: O0

iterator __thiscall Disa::Matrix_Sparse::end(Matrix_Sparse *this)

{
  size_t i_row;
  size_t extraout_RDX;
  Matrix_Sparse *in_RSI;
  iterator iVar1;
  Matrix_Sparse *this_local;
  
  i_row = size_row(in_RSI);
  Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse>::Iterator_Matrix_Sparse_Row
            ((Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse> *)this,i_row,in_RSI);
  iVar1.matrix_row.row_index = extraout_RDX;
  iVar1.matrix_row.matrix = this;
  return (iterator)iVar1.matrix_row;
}

Assistant:

Matrix_Sparse::iterator Matrix_Sparse::end() noexcept {
  return {size_row(), this};
}